

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function.h
# Opt level: O2

Client * __thiscall
kj::Function<capnproto_test::capnp::test::TestMembrane::Thing::Client_()>::
Impl<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/membrane-test.c++:213:17)>
::operator()(Client *__return_storage_ptr__,
            Impl<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_capnp_membrane_test_c__:213:17)>
            *this)

{
  Own<capnp::_::(anonymous_namespace)::ThingImpl> local_20;
  
  heap<capnp::_::(anonymous_namespace)::ThingImpl,char_const(&)[8]>
            ((kj *)&local_20,(char (*) [8])0x4d05c6);
  capnproto_test::capnp::test::TestMembrane::Thing::Client::
  Client<capnp::_::(anonymous_namespace)::ThingImpl,void>(__return_storage_ptr__,&local_20);
  Own<capnp::_::(anonymous_namespace)::ThingImpl>::~Own(&local_20);
  return __return_storage_ptr__;
}

Assistant:

Return operator()(Params... params) override {
      return f(kj::fwd<Params>(params)...);
    }